

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O1

CharInfo __thiscall
MeCab::CharProperty::getCharInfo(CharProperty *this,char *begin,char *end,size_t *mblen)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  
  uVar4 = (long)end - (long)begin;
  switch(this->charset_) {
  default:
    bVar1 = *begin;
    if (-1 < (char)bVar1) {
      *mblen = 1;
      uVar2 = (ushort)(byte)*begin;
      goto LAB_0014d13f;
    }
    if ((bVar1 & 0xe0) == 0xc0 && 1 < uVar4) {
      *mblen = 2;
      uVar3 = ((byte)*begin & 0x1f) << 6;
      bVar1 = begin[1];
    }
    else {
      if ((bVar1 & 0xf0) != 0xe0 || uVar4 < 3) {
        if ((bVar1 & 0xf8) == 0xf0 && 3 < uVar4) {
          *mblen = 4;
        }
        else if ((bVar1 & 0xfc) == 0xf8 && 4 < uVar4) {
          *mblen = 5;
        }
        else {
          if ((bVar1 & 0xfe) != 0xfc || uVar4 < 6) goto LAB_0014d0ac;
          *mblen = 6;
        }
        goto LAB_0014d0b3;
      }
      *mblen = 3;
      uVar3 = ((byte)begin[1] & 0x3f) << 6 | (ushort)(byte)*begin << 0xc;
      bVar1 = begin[2];
    }
    uVar2 = bVar1 & 0x3f;
    break;
  case 3:
  case 4:
    if (uVar4 < 2) {
LAB_0014d0ac:
      *mblen = 1;
LAB_0014d0b3:
      uVar2 = 0;
      goto LAB_0014d13f;
    }
    *mblen = 2;
    uVar3 = (ushort)(byte)*begin << 8;
    uVar2 = (ushort)begin[1];
    break;
  case 5:
    if (uVar4 < 2) goto LAB_0014d0ac;
    *mblen = 2;
    uVar3 = (ushort)(byte)begin[1] << 8;
    uVar2 = (ushort)*begin;
  }
  uVar2 = uVar2 | uVar3;
LAB_0014d13f:
  return this->map_[uVar2];
}

Assistant:

inline CharInfo getCharInfo(const char *begin,
                              const char *end,
                              size_t *mblen) const {
    unsigned short int t = 0;
#ifndef MECAB_USE_UTF8_ONLY
    switch (charset_) {
      case EUC_JP:  t = euc_to_ucs2(begin, end, mblen); break;
      case CP932:   t = cp932_to_ucs2(begin, end, mblen); break;
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      case ASCII:   t = ascii_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#else
    switch (charset_) {
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#endif
    return map_[t];
  }